

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::Clara::Parser::writeToStream(Parser *this,ostream *os)

{
  element_type *peVar1;
  pointer pAVar2;
  char *pcVar3;
  bool bVar4;
  pointer pHVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  ulong uVar9;
  ulong uVar10;
  HelpColumns *cols;
  pointer pHVar11;
  Arg *arg;
  pointer pAVar12;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> rows
  ;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  ulong local_160;
  Columns local_158;
  Column local_140;
  pointer local_100;
  ostream *local_f8;
  size_t local_f0;
  Column local_e8;
  Columns local_a8;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  local_88;
  Column local_70;
  
  if (((this->m_exeName).m_name.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"usage:\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
    peVar1 = (this->m_exeName).m_name.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(peVar1->_M_dataplus)._M_p,peVar1->_M_string_length);
    local_140.m_string.m_string._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_140,1);
    pAVar12 = (this->m_args).
              super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar2 = (this->m_args).
             super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pAVar12 != pAVar2) {
      bVar4 = true;
      bVar6 = true;
      do {
        if (!bVar6) {
          local_140.m_string.m_string._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_140,1);
        }
        if (((pAVar12->super_ParserRefImpl<Catch::Clara::Arg>).m_optionality == Optional) && (bVar4)
           ) {
          local_140.m_string.m_string._M_dataplus._M_p._0_1_ = 0x5b;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_140,1);
          bVar4 = false;
        }
        local_140.m_string.m_string._M_dataplus._M_p._0_1_ = 0x3c;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_140,1);
        poVar8 = (ostream *)
                 std::ostream::write((char *)poVar8,
                                     (long)(pAVar12->super_ParserRefImpl<Catch::Clara::Arg>).m_hint.
                                           m_start);
        local_140.m_string.m_string._M_dataplus._M_p._0_1_ = 0x3e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_140,1);
        iVar7 = (*(pAVar12->super_ParserRefImpl<Catch::Clara::Arg>).
                  super_ComposableParserImpl<Catch::Clara::Arg>.super_ParserBase._vptr_ParserBase[4]
                )(pAVar12);
        if (CONCAT44(extraout_var,iVar7) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ... ",5);
        }
        pAVar12 = pAVar12 + 1;
        bVar6 = false;
      } while (pAVar12 != pAVar2);
      if (!bVar4) {
        local_140.m_string.m_string._M_dataplus._M_p._0_1_ = 0x5d;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_140,1);
      }
    }
    if ((this->m_options).super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->m_options).super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(os," options",8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n\nwhere options are:\n",0x15);
  }
  getHelpColumns(&local_88,this);
  if (local_88.
      super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = 0;
    pHVar11 = local_88.
              super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar10 = (pHVar11->left)._M_string_length + 2;
      if (uVar10 < uVar9) {
        uVar10 = uVar9;
      }
      pHVar11 = pHVar11 + 1;
      uVar9 = uVar10;
    } while (pHVar11 !=
             local_88.
             super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    local_160 = 0x28;
    if (uVar10 < 0x28) {
      local_160 = uVar10;
    }
    if (local_88.
        super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_88.
        super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_f0 = 0x49 - local_160;
      local_100 = local_88.
                  super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pHVar11 = local_88.
                super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_f8 = os;
      do {
        TextFlow::AnsiSkippingString::AnsiSkippingString(&local_140.m_string,&pHVar11->left);
        local_140.m_initialIndent = 0xffffffffffffffff;
        local_140.m_width = local_160;
        local_140.m_indent = 2;
        TextFlow::Spacer(&local_70,4);
        TextFlow::operator+(&local_158,&local_140,&local_70);
        pcVar3 = (pHVar11->descriptions).m_start;
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,pcVar3,pcVar3 + (pHVar11->descriptions).m_size);
        local_e8.m_string.m_string._M_dataplus._M_p = (pointer)&local_e8.m_string.m_string.field_2;
        if (local_180 == &local_170) {
          local_e8.m_string.m_string.field_2._8_8_ = local_170._8_8_;
        }
        else {
          local_e8.m_string.m_string._M_dataplus._M_p = (pointer)local_180;
        }
        local_e8.m_string.m_string.field_2._M_allocated_capacity._1_7_ =
             local_170._M_allocated_capacity._1_7_;
        local_e8.m_string.m_string.field_2._M_local_buf[0] = local_170._M_local_buf[0];
        local_e8.m_string.m_string._M_string_length = local_178;
        local_178 = 0;
        local_170._M_local_buf[0] = '\0';
        local_e8.m_string.m_size = 0;
        local_180 = &local_170;
        TextFlow::AnsiSkippingString::preprocessString(&local_e8.m_string);
        local_e8.m_indent = 0;
        local_e8.m_initialIndent = 0xffffffffffffffff;
        local_e8.m_width = local_f0;
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
        emplace_back<Catch::TextFlow::Column>(&local_158.m_columns,&local_e8);
        pHVar5 = local_100;
        local_a8.m_columns.
        super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_158.m_columns.
             super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_a8.m_columns.
        super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_158.m_columns.
             super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_a8.m_columns.
        super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_158.m_columns.
             super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_158.m_columns.
        super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158.m_columns.
        super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158.m_columns.
        super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.m_string.m_string._M_dataplus._M_p != &local_e8.m_string.m_string.field_2) {
          operator_delete(local_e8.m_string.m_string._M_dataplus._M_p,
                          local_e8.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,
                          CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0])
                          + 1);
        }
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_158.m_columns);
        poVar8 = local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.m_string.m_string._M_dataplus._M_p != &local_70.m_string.m_string.field_2) {
          operator_delete(local_70.m_string.m_string._M_dataplus._M_p,
                          local_70.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_140.m_string.m_string._M_dataplus._M_p._1_7_,
                        local_140.m_string.m_string._M_dataplus._M_p._0_1_) !=
            &local_140.m_string.m_string.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_140.m_string.m_string._M_dataplus._M_p._1_7_,
                                   local_140.m_string.m_string._M_dataplus._M_p._0_1_),
                          local_140.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        TextFlow::operator<<(poVar8,&local_a8);
        local_140.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_140,1);
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_a8.m_columns);
        pHVar11 = pHVar11 + 1;
      } while (pHVar11 != pHVar5);
    }
  }
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void Parser::writeToStream( std::ostream& os ) const {
            if ( !m_exeName.name().empty() ) {
                os << "usage:\n"
                   << "  " << m_exeName.name() << ' ';
                bool required = true, first = true;
                for ( auto const& arg : m_args ) {
                    if ( first )
                        first = false;
                    else
                        os << ' ';
                    if ( arg.isOptional() && required ) {
                        os << '[';
                        required = false;
                    }
                    os << '<' << arg.hint() << '>';
                    if ( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if ( !required )
                    os << ']';
                if ( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:\n";
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for ( auto const& cols : rows )
                optWidth = ( std::max )( optWidth, cols.left.size() + 2 );

            optWidth = ( std::min )( optWidth, consoleWidth / 2 );

            for ( auto& cols : rows ) {
                auto row = TextFlow::Column( CATCH_MOVE(cols.left) )
                               .width( optWidth )
                               .indent( 2 ) +
                           TextFlow::Spacer( 4 ) +
                           TextFlow::Column( static_cast<std::string>(cols.descriptions) )
                               .width( consoleWidth - 7 - optWidth );
                os << row << '\n';
            }
        }